

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::string_node(CTcEmbedBuilderSgl *this,CTcToken *tok)

{
  CTcPrsNode *pCVar1;
  CTcConstVal cval;
  CTcConstVal local_38;
  
  local_38.typ_ = TC_CVT_UNK;
  local_38._32_1_ = local_38._32_1_ & 0xfe;
  CTcConstVal::set_sstr(&local_38,tok);
  pCVar1 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
  (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_00316ce0;
  *(undefined4 *)&pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  *(byte *)&pCVar1[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       *(byte *)&pCVar1[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
  pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)CONCAT44(local_38._4_4_,local_38.typ_);
  pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)local_38.val_.intval_;
  *(undefined1 *)&pCVar1[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = local_38._32_1_;
  pCVar1[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)local_38.val_.floatval_.len_;
  pCVar1[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)local_38.val_._16_8_;
  (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
  return pCVar1;
}

Assistant:

CTcPrsNode *string_node(const CTcToken *tok)
    {
        CTcConstVal cval;
        cval.set_sstr(tok);
        return new CTPNConst(&cval);
    }